

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O2

void obj_timer_checks(obj *otmp,xchar x,xchar y,int force)

{
  byte bVar1;
  uint uVar2;
  boolean bVar3;
  long lVar4;
  short func_index;
  ulong uVar5;
  
  if (otmp->otyp == 0x10e) {
    bVar1 = otmp->where;
    if ((bVar1 | 4) == 5) {
      bVar3 = is_ice(otmp->olev,(int)x,(int)y);
      if (bVar3 != '\0') {
        lVar4 = stop_timer(otmp->olev,1,otmp);
        if (lVar4 == 0) {
          lVar4 = stop_timer(otmp->olev,2,otmp);
          if (lVar4 == 0) {
            return;
          }
          func_index = 2;
        }
        else {
          func_index = 1;
        }
        uVar2 = moves;
        uVar5 = (ulong)moves;
        *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfff8ffff | 0x10000;
        lVar4 = (lVar4 - uVar5) * 2;
        otmp->age = otmp->age * 2 - uVar2;
        goto LAB_001d7245;
      }
      if (otmp->otyp != 0x10e) {
        return;
      }
    }
    if ((otmp->field_0x4c & 7) != 0) {
      if ((bVar1 == 1) && (bVar3 = is_ice(otmp->olev,(int)x,(int)y), bVar3 != '\0')) {
        return;
      }
      lVar4 = stop_timer(otmp->olev,1,otmp);
      if (lVar4 == 0) {
        lVar4 = stop_timer(otmp->olev,2,otmp);
        if (lVar4 == 0) {
          return;
        }
        func_index = 2;
      }
      else {
        func_index = 1;
      }
      uVar2 = moves;
      uVar5 = (ulong)moves;
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfff8ffff;
      lVar4 = (long)(lVar4 - uVar5) / 2;
      otmp->age = (uVar2 - otmp->age >> 1) + otmp->age;
LAB_001d7245:
      start_timer(otmp->olev,lVar4,2,func_index,otmp);
      return;
    }
  }
  return;
}

Assistant:

static void obj_timer_checks(struct obj *otmp, xchar x, xchar y,
			     int force)	/* 0 = no force so do checks, <0 = force off, >0 force on */
{
    long tleft = 0L;
    short action = ROT_CORPSE;
    boolean restart_timer = FALSE;
    boolean on_floor = (otmp->where == OBJ_FLOOR);
    boolean buried = (otmp->where == OBJ_BURIED);

    /* Check for corpses just placed on or in ice */
    if (otmp->otyp == CORPSE && (on_floor || buried) && is_ice(otmp->olev,x,y)) {
	tleft = stop_timer(otmp->olev, action, otmp);
	if (tleft == 0L) {
		action = REVIVE_MON;
		tleft = stop_timer(otmp->olev, action, otmp);
	} 
	if (tleft != 0L) {
	    long age;
	    
	    tleft = tleft - moves;
	    /* mark the corpse as being on ice */
	    ON_ICE(otmp) = 1;

	    /* Adjust the time remaining */
	    tleft *= ROT_ICE_ADJUSTMENT;
	    restart_timer = TRUE;
	    /* Adjust the age; must be same as in obj_ice_age() */
	    age = moves - otmp->age;
	    otmp->age = moves - (age * ROT_ICE_ADJUSTMENT);
	}
    }
    /* Check for corpses coming off ice */
    else if ((force < 0) ||
	     (otmp->otyp == CORPSE && ON_ICE(otmp) &&
	     ((on_floor && !is_ice(otmp->olev, x, y)) || !on_floor))) {
	tleft = stop_timer(otmp->olev, action, otmp);
	if (tleft == 0L) {
		action = REVIVE_MON;
		tleft = stop_timer(otmp->olev, action, otmp);
	}
	if (tleft != 0L) {
		long age;

		tleft = tleft - moves;
		ON_ICE(otmp) = 0;

		/* Adjust the remaining time */
		tleft /= ROT_ICE_ADJUSTMENT;
		restart_timer = TRUE;
		/* Adjust the age */
		age = moves - otmp->age;
		otmp->age = otmp->age + (age / ROT_ICE_ADJUSTMENT);
	}
    }
    /* now re-start the timer with the appropriate modifications */ 
    if (restart_timer)
	start_timer(otmp->olev, tleft, TIMER_OBJECT, action, otmp);
}